

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_traits.hpp
# Opt level: O1

type jsoncons::unicode_traits::detect_json_encoding<char>(char *data,size_t length)

{
  type tVar1;
  type tVar2;
  type tVar3;
  type tVar4;
  type tVar5;
  
  tVar5 = detect_encoding_from_bom<char>(data,length);
  if (tVar5.encoding == undetected) {
    tVar2._8_8_ = 1;
    tVar2.ptr = data;
    tVar1._8_8_ = 1;
    tVar1.ptr = data;
    tVar5._8_8_ = 1;
    tVar5.ptr = data;
    if (3 < length) {
      if (*data == '\0') {
        if ((data[1] == '\0') && (data[2] == '\0')) {
          tVar4._8_8_ = 5;
          tVar4.ptr = data;
          return tVar4;
        }
        if (data[2] == '\0') {
          tVar3._8_8_ = 3;
          tVar3.ptr = data;
          return tVar3;
        }
      }
      tVar5 = tVar1;
      if (data[1] == '\0') {
        if ((data[2] == '\0') && (data[3] == '\0')) {
          tVar5._8_8_ = 4;
        }
        else {
          tVar5 = tVar2;
          if (data[3] == '\0') {
            tVar5._8_8_ = 2;
          }
        }
      }
    }
  }
  return tVar5;
}

Assistant:

typename std::enable_if<ext_traits::is_char8<CharT>::value,detect_encoding_result<CharT>>::type
    detect_json_encoding(const CharT* data, std::size_t length)
    {
        detect_encoding_result<CharT> r = detect_encoding_from_bom(data,length);
        if (r.encoding != encoding_kind::undetected)
        {
            return r;
        }
        else if (length < 4)
        {
            return detect_encoding_result<CharT>{data,encoding_kind::utf8};
        }
        else if (*data == 0 && *(data+1) == 0 && *(data+2) == 0)
        {
            return detect_encoding_result<CharT>{data,encoding_kind::utf32be};
        }
        else if (*data == 0 && *(data+2) == 0)
        {
            return detect_encoding_result<CharT>{data,encoding_kind::utf16be};
        }
        else if (*(data+1) == 0 && *(data+2) == 0 && *(data+3) == 0)
        {
            return detect_encoding_result<CharT>{data,encoding_kind::utf32le};
        }
        else if (*(data+1) == 0 && *(data+3) == 0)
        {
            return detect_encoding_result<CharT>{data,encoding_kind::utf16le};
        }
        else
        {
            return detect_encoding_result<CharT>{data,encoding_kind::utf8};
        }
    }